

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2BitstateCaptureBug(void)

{
  once_flag *this;
  bool bVar1;
  int endpos;
  ostream *poVar2;
  LogMessage local_2b0;
  undefined1 local_120 [8];
  StringPiece s;
  undefined1 local_100 [8];
  RE2 re;
  Options opt;
  
  this = &re.named_groups_once_;
  RE2::Options::Options((Options *)this);
  RE2::Options::set_max_mem((Options *)this,20000);
  StringPiece::StringPiece((StringPiece *)&s.length_,"(_________$)");
  RE2::RE2((RE2 *)local_100,(StringPiece *)&s.length_,(Options *)this);
  StringPiece::StringPiece((StringPiece *)local_120,"xxxxxxxxxxxxxxxxxxxxxxxxxx_________x");
  endpos = StringPiece::size((StringPiece *)local_120);
  bVar1 = RE2::Match((RE2 *)local_100,(StringPiece *)local_120,0,endpos,UNANCHORED,
                     (StringPiece *)0x0,0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x549);
    poVar2 = LogMessage::stream(&local_2b0);
    std::operator<<(poVar2,"Check failed: !(re.Match(s, 0, s.size(), RE2::UNANCHORED, __null, 0))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

TEST(RE2, BitstateCaptureBug) {
  RE2::Options opt;
  opt.set_max_mem(20000);
  RE2 re("(_________$)", opt);
  StringPiece s = "xxxxxxxxxxxxxxxxxxxxxxxxxx_________x";
  EXPECT_FALSE(re.Match(s, 0, s.size(), RE2::UNANCHORED, NULL, 0));
}